

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase *
EvaluateGenericFunctionPrototype
          (ExpressionEvalContext *ctx,ExprGenericFunctionPrototype *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  ExprVariableDefinition *expression_00;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instructionsLimit <= ctx->instruction) {
      Report(ctx,"ERROR: instruction limit reached");
      return (ExprBase *)0x0;
    }
    ctx->instruction = ctx->instruction + 1;
    for (expression_00 = (expression->contextVariables).head;
        expression_00 != (ExprVariableDefinition *)0x0;
        expression_00 = (ExprVariableDefinition *)(expression_00->super_ExprBase).next) {
      pEVar6 = Evaluate(ctx,&expression_00->super_ExprBase);
      if (pEVar6 == (ExprBase *)0x0) {
        if (expression_00 != (ExprVariableDefinition *)0x0) {
          return (ExprBase *)0x0;
        }
        break;
      }
    }
  }
  pAVar2 = ctx->ctx->allocator;
  iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = ctx->ctx->typeVoid;
  pEVar6->typeID = 2;
  pEVar6->source = pSVar3;
  pEVar6->type = pTVar4;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6b40;
  return pEVar6;
}

Assistant:

ExprBase* EvaluateGenericFunctionPrototype(ExpressionEvalContext &ctx, ExprGenericFunctionPrototype *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	for(ExprBase *expr = expression->contextVariables.head; expr; expr = expr->next)
	{
		if(!Evaluate(ctx, expr))
			return NULL;
	}

	return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);
}